

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void duckdb::DecimalRoundPositivePrecisionFunction<short,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  anon_class_16_2_0b9647cc fun;
  byte bVar1;
  short sVar2;
  RoundPrecisionFunctionData *pRVar3;
  pointer pEVar4;
  reference count;
  Vector *in_RDX;
  BaseExpression *in_RSI;
  DataChunk *in_RDI;
  short addition;
  short power_of_ten;
  uint8_t source_scale;
  RoundPrecisionFunctionData *info;
  BoundFunctionExpression *func_expr;
  undefined7 in_stack_ffffffffffffffa8;
  FunctionErrors in_stack_ffffffffffffffaf;
  FunctionData *in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffd0;
  short sVar5;
  undefined1 in_stack_ffffffffffffffd6;
  
  BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_RSI);
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator->
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_ffffffffffffffb0);
  pRVar3 = FunctionData::Cast<duckdb::RoundPrecisionFunctionData>(in_stack_ffffffffffffffb0);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_ffffffffffffffb0,
               CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_ffffffffffffffb0);
  bVar1 = duckdb::DecimalType::GetScale((LogicalType *)(pEVar4 + 0x38));
  sVar2 = UnsafeNumericCast<short,long,void>
                    ((&NumericHelper::POWERS_OF_TEN)[(int)((uint)bVar1 - pRVar3->target_scale)]);
  sVar5 = sVar2 / 2;
  count = vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffffb0,
                     CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  DataChunk::size(in_RDI);
  fun.power_of_ten._0_2_ = in_stack_ffffffffffffffd0;
  fun.addition = (short *)&stack0xffffffffffffffd4;
  fun.power_of_ten._2_2_ = sVar5;
  fun.power_of_ten._4_2_ = sVar2;
  fun.power_of_ten._6_1_ = in_stack_ffffffffffffffd6;
  fun.power_of_ten._7_1_ = bVar1;
  UnaryExecutor::
  Execute<short,short,duckdb::DecimalRoundPositivePrecisionFunction<short,duckdb::NumericHelper>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(short)_1_>
            ((Vector *)&stack0xffffffffffffffd2,in_RDX,(idx_t)count,fun,in_stack_ffffffffffffffaf);
  return;
}

Assistant:

static void DecimalRoundPositivePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[source_scale - info.target_scale]);
	T addition = power_of_ten / 2;
	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / power_of_ten);
	});
}